

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm.cpp
# Opt level: O2

int __thiscall ncnn::LayerNorm::forward_inplace(LayerNorm *this,Mat *bottom_top_blob,Option *opt)

{
  size_t sVar1;
  void *pvVar2;
  void *pvVar3;
  int i;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  int j;
  ulong uVar9;
  int j_2;
  uint uVar10;
  int _c;
  undefined1 in_XMM1 [16];
  float fVar11;
  float fVar12;
  undefined1 in_XMM5 [16];
  undefined1 auVar13 [16];
  float fVar14;
  Mat local_78;
  
  if (bottom_top_blob->dims == 3) {
    uVar10 = bottom_top_blob->h * bottom_top_blob->w;
    uVar7 = 0;
    uVar6 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar6 = uVar7;
    }
    iVar4 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      iVar4 = 0;
    }
    while (_c = (int)uVar7, _c != iVar4) {
      Mat::channel(&local_78,bottom_top_blob,_c);
      pvVar8 = local_78.data;
      Mat::~Mat(&local_78);
      fVar11 = 0.0;
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        fVar11 = fVar11 + *(float *)((long)pvVar8 + uVar7 * 4);
      }
      fVar11 = fVar11 * (1.0 / (float)(int)uVar10);
      fVar14 = 0.0;
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        fVar12 = *(float *)((long)pvVar8 + uVar7 * 4) - fVar11;
        fVar12 = fVar12 * fVar12;
        in_XMM1 = ZEXT416((uint)fVar12);
        fVar14 = fVar14 + fVar12;
      }
      fVar12 = fVar14 * (1.0 / (float)(int)uVar10) + this->eps;
      auVar13 = rsqrtss(in_XMM1,ZEXT416((uint)fVar12));
      fVar14 = auVar13._0_4_;
      in_XMM1._4_12_ = auVar13._4_12_;
      in_XMM1._0_4_ = fVar14 * -0.5 * (fVar12 * fVar14 * fVar14 + -3.0);
      fVar11 = -fVar11 * in_XMM1._0_4_;
      if (this->affine == 0) {
        for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          *(float *)((long)pvVar8 + uVar7 * 4) =
               *(float *)((long)pvVar8 + uVar7 * 4) * in_XMM1._0_4_ + fVar11;
        }
      }
      else {
        pvVar2 = (this->gamma_data).data;
        pvVar3 = (this->beta_data).data;
        for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          *(float *)((long)pvVar8 + uVar7 * 4) =
               (*(float *)((long)pvVar8 + uVar7 * 4) * in_XMM1._0_4_ + fVar11) *
               *(float *)((long)pvVar2 + uVar7 * 4) + *(float *)((long)pvVar3 + uVar7 * 4);
        }
      }
      uVar7 = (ulong)(_c + 1);
    }
  }
  else if (bottom_top_blob->dims == 2) {
    uVar10 = bottom_top_blob->w;
    uVar6 = 0;
    uVar7 = 0;
    if (0 < (int)uVar10) {
      uVar7 = (ulong)uVar10;
    }
    pvVar8 = bottom_top_blob->data;
    uVar5 = (ulong)(uint)bottom_top_blob->h;
    if (bottom_top_blob->h < 1) {
      uVar5 = uVar6;
    }
    iVar4 = this->affine;
    sVar1 = bottom_top_blob->elemsize;
    for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      fVar11 = 0.0;
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        fVar11 = fVar11 + *(float *)((long)pvVar8 + uVar9 * 4);
      }
      fVar11 = fVar11 * (1.0 / (float)(int)uVar10);
      fVar14 = 0.0;
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        fVar12 = *(float *)((long)pvVar8 + uVar9 * 4) - fVar11;
        fVar12 = fVar12 * fVar12;
        in_XMM5 = ZEXT416((uint)fVar12);
        fVar14 = fVar14 + fVar12;
      }
      fVar12 = fVar14 * (1.0 / (float)(int)uVar10) + this->eps;
      auVar13 = rsqrtss(in_XMM5,ZEXT416((uint)fVar12));
      fVar14 = auVar13._0_4_;
      in_XMM5._4_12_ = auVar13._4_12_;
      in_XMM5._0_4_ = fVar14 * -0.5 * (fVar12 * fVar14 * fVar14 + -3.0);
      fVar11 = -fVar11 * in_XMM5._0_4_;
      if (iVar4 == 0) {
        for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
          *(float *)((long)pvVar8 + uVar9 * 4) =
               *(float *)((long)pvVar8 + uVar9 * 4) * in_XMM5._0_4_ + fVar11;
        }
      }
      else {
        pvVar2 = (this->gamma_data).data;
        pvVar3 = (this->beta_data).data;
        for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
          *(float *)((long)pvVar8 + uVar9 * 4) =
               (*(float *)((long)pvVar8 + uVar9 * 4) * in_XMM5._0_4_ + fVar11) *
               *(float *)((long)pvVar2 + uVar9 * 4) + *(float *)((long)pvVar3 + uVar9 * 4);
        }
      }
      pvVar8 = (void *)((long)pvVar8 + (long)(int)uVar10 * sVar1);
    }
  }
  return 0;
}

Assistant:

int LayerNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / sqrt(var + eps) * gamma + beta

    int dims = bottom_top_blob.dims;

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        // assert affine_size == w

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            // mean and var
            float sum = 0.f;
            float sqsum = 0.f;
            for (int j = 0; j < w; j++)
            {
                sum += ptr[j];
                //sqsum += ptr[j] * ptr[j];
            }
            float mean = sum / w;
            float tmp = 0.f;
            for (int j = 0; j < w; j++)
            {
                tmp = ptr[j] - mean;
                sqsum += tmp * tmp;
            }
            float var = sqsum / w;
            // the var maybe minus due to accuracy
            //float var = sqsum / w - mean * mean;

            float a = static_cast<float>(1.f / (sqrt(var + eps)));
            float b = -mean * a;

            if (affine)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = (ptr[j] * a + b) * gamma_data[j] + beta_data[j];
                }
            }
            else
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = ptr[j] * a + b;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;
        // assert affine_size == size

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            // mean and var
            float sum = 0.f;
            float sqsum = 0.f;
            for (int i = 0; i < size; i++)
            {
                sum += ptr[i];
                //sqsum += ptr[i] * ptr[i];
            }
            float mean = sum / size;
            float tmp = 0.f;
            for (int i = 0; i < size; i++)
            {
                tmp = ptr[i] - mean;
                sqsum += tmp * tmp;
            }
            float var = sqsum / size;
            // the var maybe minus due to accuracy
            //float var = sqsum / size - mean * mean;

            float a = static_cast<float>(1.f / (sqrt(var + eps)));
            float b = -mean * a;

            if (affine)
            {
                for (int i = 0; i < size; i++)
                {
                    ptr[i] = (ptr[i] * a + b) * gamma_data[i] + beta_data[i];
                }
            }
            else
            {
                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * a + b;
                }
            }
        }
    }

    return 0;
}